

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::func_type_decl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type)

{
  ExecutionModel EVar1;
  bool bVar2;
  SPIRType *pSVar3;
  SPIREntryPoint *pSVar4;
  CompilerError *this_00;
  char (*in_R8) [12];
  _Alloc_hider in_stack_ffffffffffffff68;
  string entry_type;
  string return_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&entry_type,this,type,0);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
            (&stack0xffffffffffffff68,this,type,0);
  ::std::operator+(&return_type,&entry_type,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff68);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  ::std::__cxx11::string::~string((string *)&entry_type);
  if ((this->super_CompilerGLSL).processing_entry_point == false) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)return_type._M_dataplus._M_p == &return_type.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(return_type.field_2._M_allocated_capacity._1_7_,
                    return_type.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = return_type.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = return_type._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(return_type.field_2._M_allocated_capacity._1_7_,
                    return_type.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = return_type._M_string_length;
    return_type._M_string_length = 0;
    return_type.field_2._M_local_buf[0] = '\0';
    return_type._M_dataplus._M_p = (pointer)&return_type.field_2;
    goto LAB_001ecf42;
  }
  bVar2 = get_is_rasterization_disabled(this);
  if (!bVar2 && (this->stage_out_var_id).id != 0) {
    pSVar3 = get_stage_out_struct_type(this);
    in_R8 = (char (*) [12])(this->super_CompilerGLSL).super_Compiler._vptr_Compiler;
    (**(_func_int **)(in_R8[0xc] + 8))(&stack0xffffffffffffff68,this,pSVar3,0);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])(&local_38,this,type,0);
    ::std::operator+(&entry_type,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffff68,&local_38);
    ::std::__cxx11::string::operator=((string *)&return_type,(string *)&entry_type);
    ::std::__cxx11::string::~string((string *)&entry_type);
    ::std::__cxx11::string::~string((string *)&local_38);
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  }
  entry_type._M_dataplus._M_p = (pointer)&entry_type.field_2;
  entry_type._M_string_length = 0;
  entry_type.field_2._M_local_buf[0] = '\0';
  pSVar4 = Compiler::get_entry_point((Compiler *)this);
  EVar1 = pSVar4->model;
  switch(EVar1) {
  case ExecutionModelVertex:
    if (((this->msl_options).vertex_for_tessellation == true) &&
       ((this->msl_options).msl_version < 0x27d8)) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10,"kernel");
      CompilerError::CompilerError(this_00,"Tessellation requires Metal 1.2.");
      goto LAB_001ed021;
    }
    break;
  case ExecutionModelTessellationControl:
    if ((this->msl_options).msl_version < 0x27d8) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10,"kernel");
      CompilerError::CompilerError(this_00,"Tessellation requires Metal 1.2.");
LAB_001ed021:
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (((pSVar4->flags).lower & 0x2000000) != 0) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10,"kernel");
      CompilerError::CompilerError(this_00,"Metal does not support isoline tessellation.");
      goto LAB_001ed021;
    }
    break;
  case ExecutionModelTessellationEvaluation:
    if ((this->msl_options).msl_version < 0x27d8) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10,"kernel");
      CompilerError::CompilerError(this_00,"Tessellation requires Metal 1.2.");
      goto LAB_001ed021;
    }
    if (((pSVar4->flags).lower & 0x2000000) != 0) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10,"kernel");
      CompilerError::CompilerError(this_00,"Metal does not support isoline tessellation.");
      goto LAB_001ed021;
    }
    if ((this->msl_options).platform == iOS) {
      bVar2 = Compiler::is_tessellating_triangles((Compiler *)this);
      local_38._M_dataplus._M_p = "quad";
      if (bVar2) {
        local_38._M_dataplus._M_p = "triangle";
      }
      join<char_const(&)[10],char_const*,char_const(&)[12]>
                ((string *)&stack0xffffffffffffff68,(spirv_cross *)"[[ patch(",
                 (char (*) [10])&local_38,(char **)") ]] vertex",in_R8);
    }
    else {
      bVar2 = Compiler::is_tessellating_triangles((Compiler *)this);
      local_38._M_dataplus._M_p = "quad";
      if (bVar2) {
        local_38._M_dataplus._M_p = "triangle";
      }
      join<char_const(&)[10],char_const*,char_const(&)[3],unsigned_int&,char_const(&)[12]>
                ((string *)&stack0xffffffffffffff68,(spirv_cross *)"[[ patch(",
                 (char (*) [10])&local_38,(char **)0x294843,(char (*) [3])&pSVar4->output_vertices,
                 (uint *)") ]] vertex",(char (*) [12])in_stack_ffffffffffffff68._M_p);
    }
    ::std::__cxx11::string::operator=((string *)&entry_type,(string *)&stack0xffffffffffffff68);
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
    goto LAB_001ecf0c;
  case ExecutionModelGeometry:
switchD_001ecd84_caseD_3:
    break;
  case ExecutionModelFragment:
    uses_explicit_early_fragment_test(this);
    break;
  case ExecutionModelGLCompute:
  case ExecutionModelKernel:
    break;
  default:
    if ((EVar1 != ExecutionModelTaskEXT) && (EVar1 != ExecutionModelMeshEXT))
    goto switchD_001ecd84_caseD_3;
  }
  ::std::__cxx11::string::assign((char *)&entry_type);
LAB_001ecf0c:
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff68,&entry_type," ");
  ::std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff68,&return_type);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  ::std::__cxx11::string::~string((string *)&entry_type);
LAB_001ecf42:
  ::std::__cxx11::string::~string((string *)&return_type);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::func_type_decl(SPIRType &type)
{
	// The regular function return type. If not processing the entry point function, that's all we need
	string return_type = type_to_glsl(type) + type_to_array_glsl(type, 0);
	if (!processing_entry_point)
		return return_type;

	// If an outgoing interface block has been defined, and it should be returned, override the entry point return type
	bool ep_should_return_output = !get_is_rasterization_disabled();
	if (stage_out_var_id && ep_should_return_output)
		return_type = type_to_glsl(get_stage_out_struct_type()) + type_to_array_glsl(type, 0);

	// Prepend a entry type, based on the execution model
	string entry_type;
	auto &execution = get_entry_point();
	switch (execution.model)
	{
	case ExecutionModelVertex:
		if (msl_options.vertex_for_tessellation && !msl_options.supports_msl_version(1, 2))
			SPIRV_CROSS_THROW("Tessellation requires Metal 1.2.");
		entry_type = msl_options.vertex_for_tessellation ? "kernel" : "vertex";
		break;
	case ExecutionModelTessellationEvaluation:
		if (!msl_options.supports_msl_version(1, 2))
			SPIRV_CROSS_THROW("Tessellation requires Metal 1.2.");
		if (execution.flags.get(ExecutionModeIsolines))
			SPIRV_CROSS_THROW("Metal does not support isoline tessellation.");
		if (msl_options.is_ios())
			entry_type = join("[[ patch(", is_tessellating_triangles() ? "triangle" : "quad", ") ]] vertex");
		else
			entry_type = join("[[ patch(", is_tessellating_triangles() ? "triangle" : "quad", ", ",
			                  execution.output_vertices, ") ]] vertex");
		break;
	case ExecutionModelFragment:
		entry_type = uses_explicit_early_fragment_test() ? "[[ early_fragment_tests ]] fragment" : "fragment";
		break;
	case ExecutionModelTessellationControl:
		if (!msl_options.supports_msl_version(1, 2))
			SPIRV_CROSS_THROW("Tessellation requires Metal 1.2.");
		if (execution.flags.get(ExecutionModeIsolines))
			SPIRV_CROSS_THROW("Metal does not support isoline tessellation.");
		/* fallthrough */
	case ExecutionModelGLCompute:
	case ExecutionModelKernel:
		entry_type = "kernel";
		break;
	case ExecutionModelMeshEXT:
		entry_type = "[[mesh]]";
		break;
	case ExecutionModelTaskEXT:
		entry_type = "[[object]]";
		break;
	default:
		entry_type = "unknown";
		break;
	}

	return entry_type + " " + return_type;
}